

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

Parser * __thiscall cli::Parser::get<std::__cxx11::string>(Parser *this,string *name)

{
  _func_int **pp_Var1;
  bool bVar2;
  __type _Var3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long local_100;
  char local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [35];
  undefined1 local_95;
  char local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  long local_48;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *cmd
  ;
  CmdBase **command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *__range2;
  string *name_local;
  Parser *this_local;
  
  __end2 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::begin
                     ((vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *)
                      (name + 0x38));
  command = (CmdBase **)
            std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::end
                      ((vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *)
                       (name + 0x38));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                                *)&command);
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "The parameter ");
      std::operator+(local_b8,local_d8);
      std::runtime_error::runtime_error(prVar4,(string *)local_b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cmd = (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)__gnu_cxx::
             __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
             ::operator*(&__end2);
    _Var3 = std::operator==(&((CmdBase *)(cmd->super_CmdBase)._vptr_CmdBase)->name,in_RDX);
    if (_Var3) break;
    __gnu_cxx::
    __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
    ::operator++(&__end2);
  }
  pp_Var1 = (cmd->super_CmdBase)._vptr_CmdBase;
  if (pp_Var1 == (_func_int **)0x0) {
    local_100 = 0;
  }
  else {
    local_100 = __dynamic_cast(pp_Var1,&CmdBase::typeinfo,
                               &CmdArgument<std::__cxx11::string>::typeinfo,0);
  }
  local_48 = local_100;
  if (local_100 == 0) {
    local_95 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Invalid usage of the parameter ");
    std::operator+(local_68,local_88);
    std::runtime_error::runtime_error(prVar4,(string *)local_68);
    local_95 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)this,(string *)(local_100 + 0xa8));
  return this;
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}